

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessianUtils.cpp
# Opt level: O1

HighsStatus extractTriangularHessian(HighsOptions *options,HighsHessian *hessian)

{
  ulong uVar1;
  uint uVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pdVar5;
  HighsStatus HVar6;
  int iVar7;
  ulong uVar8;
  HighsInt nnz0;
  int iVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  
  uVar11 = (ulong)hessian->dim_;
  HVar6 = kOk;
  iVar7 = 0;
  if (0 < (long)uVar11) {
    piVar3 = (hessian->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (hessian->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = 0;
    iVar9 = 0;
    do {
      lVar10 = (long)piVar3[uVar8];
      uVar1 = uVar8 + 1;
      iVar7 = iVar9;
      if (piVar3[uVar8] < piVar3[uVar8 + 1]) {
        pdVar5 = (hessian->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          uVar2 = piVar4[lVar10];
          if ((long)uVar8 <= (long)(int)uVar2) {
            piVar4[iVar7] = uVar2;
            pdVar5[iVar7] = pdVar5[lVar10];
            if ((uVar8 == uVar2) && (iVar9 < iVar7)) {
              piVar4[iVar7] = piVar4[iVar9];
              pdVar5[iVar7] = pdVar5[iVar9];
              piVar4[iVar9] = uVar2;
              pdVar5[iVar9] = pdVar5[lVar10];
            }
            iVar7 = iVar7 + 1;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < piVar3[uVar1]);
      }
      piVar3[uVar8] = iVar9;
      uVar8 = uVar1;
      iVar9 = iVar7;
    } while (uVar1 != uVar11);
  }
  if ((hessian->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar11] != iVar7) {
    bVar12 = hessian->format_ == kTriangular;
    if (bVar12) {
      highsLogUser(&(options->super_HighsOptionsStruct).log_options,kWarning,
                   "Ignored %d entries of Hessian in opposite triangle\n");
    }
    HVar6 = (HighsStatus)bVar12;
    (hessian->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar11] = iVar7;
  }
  hessian->format_ = kTriangular;
  return HVar6;
}

Assistant:

HighsStatus extractTriangularHessian(const HighsOptions& options,
                                     HighsHessian& hessian) {
  // Viewing the Hessian column-wise, remove any entries in the strict
  // upper triangle
  HighsStatus return_status = HighsStatus::kOk;
  const HighsInt dim = hessian.dim_;
  HighsInt nnz = 0;
  for (HighsInt iCol = 0; iCol < dim; iCol++) {
    const HighsInt nnz0 = nnz;
    for (HighsInt iEl = hessian.start_[iCol]; iEl < hessian.start_[iCol + 1];
         iEl++) {
      HighsInt iRow = hessian.index_[iEl];
      if (iRow < iCol) continue;
      hessian.index_[nnz] = iRow;
      hessian.value_[nnz] = hessian.value_[iEl];
      if (iRow == iCol && nnz > nnz0) {
        // Diagonal entry is not first in column so swap it in
        hessian.index_[nnz] = hessian.index_[nnz0];
        hessian.value_[nnz] = hessian.value_[nnz0];
        hessian.index_[nnz0] = iRow;
        hessian.value_[nnz0] = hessian.value_[iEl];
      }
      nnz++;
    }
    hessian.start_[iCol] = nnz0;
  }
  const HighsInt num_ignored_nz = hessian.start_[dim] - nnz;
  assert(num_ignored_nz >= 0);
  if (num_ignored_nz) {
    if (hessian.format_ == HessianFormat::kTriangular) {
      highsLogUser(options.log_options, HighsLogType::kWarning,
                   "Ignored %" HIGHSINT_FORMAT
                   " entries of Hessian in opposite triangle\n",
                   num_ignored_nz);
      return_status = HighsStatus::kWarning;
    }
    hessian.start_[dim] = nnz;
  }
  assert(hessian.start_[dim] == nnz);
  hessian.format_ = HessianFormat::kTriangular;
  return return_status;
}